

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

void __thiscall CorUnix::CPalThread::SetStartStatus(CPalThread *this,bool fStartSucceeded)

{
  int iVar1;
  
  if (this->m_fStartStatusSet == true) {
    fprintf(_stderr,"] %s %s:%d","SetStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x85e);
    fprintf(_stderr,"Multiple calls to CPalThread::SetStartStatus\n");
  }
  this->m_bCreateSuspended = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_startMutex);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","SetStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x86f);
    fprintf(_stderr,"pthread primitive failure\n");
  }
  this->m_fStartStatus = fStartSucceeded;
  this->m_fStartStatusSet = true;
  iVar1 = pthread_cond_signal((pthread_cond_t *)&this->m_startCond);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","SetStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x879);
    fprintf(_stderr,"pthread primitive failure\n");
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_startMutex);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","SetStartStatus",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x880);
    fprintf(_stderr,"pthread primitive failure\n");
    return;
  }
  return;
}

Assistant:

void
CPalThread::SetStartStatus(
    bool fStartSucceeded
    )
{
    int iError;

#if _DEBUG
    if (m_fStartStatusSet)
    {
        ASSERT("Multiple calls to CPalThread::SetStartStatus\n");
    }
#endif

    //
    // This routine may get called from CPalThread::ThreadEntry
    //
    // If we've reached this point there are no further thread
    // suspensions that happen at creation time, so reset
    // m_bCreateSuspended
    //

    m_bCreateSuspended = FALSE;

    iError = pthread_mutex_lock(&m_startMutex);
    if (0 != iError)
    {
        ASSERT("pthread primitive failure\n");
        // bugcheck?
    }

    m_fStartStatus = fStartSucceeded;
    m_fStartStatusSet = TRUE;

    iError = pthread_cond_signal(&m_startCond);
    if (0 != iError)
    {
        ASSERT("pthread primitive failure\n");
        // bugcheck?
    }

    iError = pthread_mutex_unlock(&m_startMutex);
    if (0 != iError)
    {
        ASSERT("pthread primitive failure\n");
        // bugcheck?
    }
}